

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QSimplexVariable_*>::data(QList<QSimplexVariable_*> *this)

{
  QArrayDataPointer<QSimplexVariable_*> *this_00;
  QSimplexVariable **ppQVar1;
  QArrayDataPointer<QSimplexVariable_*> *in_RDI;
  
  detach((QList<QSimplexVariable_*> *)0xa6089c);
  this_00 = (QArrayDataPointer<QSimplexVariable_*> *)
            QArrayDataPointer<QSimplexVariable_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QSimplexVariable_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }